

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_EnumTypeCompile_Test::
ExtensionDeclarationsTest_EnumTypeCompile_Test(ExtensionDeclarationsTest_EnumTypeCompile_Test *this)

{
  ExtensionDeclarationsTest_EnumTypeCompile_Test *this_local;
  
  testing::TestWithParam<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams>::
  TestWithParam(&this->super_ExtensionDeclarationsTest);
  (this->super_ExtensionDeclarationsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ExtensionDeclarationsTest_EnumTypeCompile_Test_029aefe0;
  (this->super_ExtensionDeclarationsTest).
  super_WithParamInterface<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__ExtensionDeclarationsTest_EnumTypeCompile_Test_029af020;
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, EnumTypeCompile) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.bar"
                type: ".ext.test.Bar"
              }
            }
          }
        }
        enum_type {
          name: "Bar"
          value: { name: "BUZ" number: 123 }
        }
        extension { extendee: "Foo" name: "bar" number: 10 type_name: "Bar" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  EXPECT_NE(pool.BuildFile(*file_proto), nullptr);
}